

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O0

void * __thiscall
MultiANN::NearestNeighbor(MultiANN *this,ANNpoint *x,int *best_idx,double *best_dist)

{
  long lVar1;
  int iVar2;
  double *in_RCX;
  int *in_RDX;
  long *in_RSI;
  int *in_RDI;
  double dVar3;
  double dVar4;
  double dtheta;
  double norm2;
  double norm1;
  double fd;
  double t1;
  double t;
  int i;
  ANNpoint x1;
  double d_min;
  double d;
  int k;
  int n_last;
  int n;
  double *in_stack_ffffffffffffff60;
  ANNpoint *in_stack_ffffffffffffff68;
  double *in_stack_ffffffffffffff70;
  ANN *in_stack_ffffffffffffff80;
  double local_68;
  int local_4c;
  double local_40;
  double local_38;
  int local_2c;
  int local_28;
  int local_24;
  
  local_28 = 0;
  local_40 = INFINITY;
  for (local_2c = 0x1e; 3 < local_2c; local_2c = local_2c + -1) {
    if (*(long *)(in_RDI + (long)local_2c * 2 + 0xe) != 0) {
      iVar2 = ANN::NearestNeighbor
                        (in_stack_ffffffffffffff80,in_RDI,in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      if (0.0 < local_40) {
        local_40 = 0.0;
        *in_RDX = iVar2;
      }
      local_28 = ANN::LastNode(*(ANN **)(in_RDI + (long)local_2c * 2 + 0xe));
      if (local_28 != *in_RDI) {
        local_28 = local_28 + 1;
      }
    }
  }
  for (local_24 = local_28; local_24 != *in_RDI; local_24 = local_24 + 1) {
    lVar1 = *(long *)(*(long *)(in_RDI + 4) + (long)local_24 * 8);
    local_38 = 0.0;
    for (local_4c = 0; local_4c < in_RDI[1]; local_4c = local_4c + 1) {
      if (*(int *)(*(long *)(in_RDI + 10) + (long)local_4c * 4) == 1) {
        local_38 = *(double *)(*(long *)(in_RDI + 0xc) + (long)local_4c * 8) *
                   (*(double *)(lVar1 + (long)local_4c * 8) -
                   *(double *)(*in_RSI + (long)local_4c * 8)) *
                   *(double *)(*(long *)(in_RDI + 0xc) + (long)local_4c * 8) *
                   (*(double *)(lVar1 + (long)local_4c * 8) -
                   *(double *)(*in_RSI + (long)local_4c * 8)) + local_38;
      }
      else if (*(int *)(*(long *)(in_RDI + 10) + (long)local_4c * 4) == 2) {
        dVar3 = ABS(*(double *)(lVar1 + (long)local_4c * 8) -
                    *(double *)(*in_RSI + (long)local_4c * 8));
        if (6.283185307179586 - dVar3 < dVar3) {
          dVar3 = 6.283185307179586 - dVar3;
        }
        local_38 = *(double *)(*(long *)(in_RDI + 0xc) + (long)local_4c * 8) * dVar3 *
                   *(double *)(*(long *)(in_RDI + 0xc) + (long)local_4c * 8) * dVar3 + local_38;
      }
      else if (*(int *)(*(long *)(in_RDI + 10) + (long)local_4c * 4) == 3) {
        local_68 = *(double *)(lVar1 + (long)(local_4c + 3) * 8) *
                   *(double *)(*in_RSI + (long)(local_4c + 3) * 8) +
                   *(double *)(lVar1 + (long)(local_4c + 2) * 8) *
                   *(double *)(*in_RSI + (long)(local_4c + 2) * 8) +
                   *(double *)(lVar1 + (long)local_4c * 8) *
                   *(double *)(*in_RSI + (long)local_4c * 8) +
                   *(double *)(lVar1 + (long)(local_4c + 1) * 8) *
                   *(double *)(*in_RSI + (long)(local_4c + 1) * 8);
        if (1.0 < local_68) {
          local_68 = local_68 /
                     ((*(double *)(lVar1 + (long)(local_4c + 3) * 8) *
                       *(double *)(lVar1 + (long)(local_4c + 3) * 8) +
                      *(double *)(lVar1 + (long)(local_4c + 2) * 8) *
                      *(double *)(lVar1 + (long)(local_4c + 2) * 8) +
                      *(double *)(lVar1 + (long)local_4c * 8) *
                      *(double *)(lVar1 + (long)local_4c * 8) +
                      *(double *)(lVar1 + (long)(local_4c + 1) * 8) *
                      *(double *)(lVar1 + (long)(local_4c + 1) * 8)) *
                     (*(double *)(*in_RSI + (long)(local_4c + 3) * 8) *
                      *(double *)(*in_RSI + (long)(local_4c + 3) * 8) +
                     *(double *)(*in_RSI + (long)(local_4c + 2) * 8) *
                     *(double *)(*in_RSI + (long)(local_4c + 2) * 8) +
                     *(double *)(*in_RSI + (long)local_4c * 8) *
                     *(double *)(*in_RSI + (long)local_4c * 8) +
                     *(double *)(*in_RSI + (long)(local_4c + 1) * 8) *
                     *(double *)(*in_RSI + (long)(local_4c + 1) * 8)));
        }
        dVar3 = acos(local_68);
        dVar4 = acos(-local_68);
        if (dVar3 <= dVar4) {
          dVar3 = acos(local_68);
        }
        else {
          dVar3 = acos(-local_68);
        }
        local_38 = *(double *)(*(long *)(in_RDI + 0xc) + (long)local_4c * 8) * dVar3 *
                   *(double *)(*(long *)(in_RDI + 0xc) + (long)local_4c * 8) * dVar3 + local_38;
        local_4c = local_4c + 3;
      }
    }
    dVar3 = sqrt(local_38);
    if (dVar3 < local_40) {
      *in_RDX = local_24;
      local_40 = dVar3;
    }
  }
  *in_RCX = local_40;
  return *(void **)(*(long *)(in_RDI + 6) + (long)*in_RDX * 8);
}

Assistant:

void *MultiANN::NearestNeighbor(  // 1-nearest neighbor query
    const ANNpoint &x,            // query point
    int &best_idx,      // index of the nearest neighbor to x (returned)
    double &best_dist)  // distance from the nearest neighbor to x (returned)
{
    int n, n_last;
    int k;
    double d, d_min;

    n = n_last = 0;  // Keeps the warnings away
    d_min = INFINITY;
    d = 0.0;

    for (k = ANN_MAXIMUM_INDEX; k >= ANN_STARTING_INDEX;
         k--) {             // Find the nearest neighbor
        if (AnnArray[k]) {  // First check the ANN trees
            d = 0.0;
            n = AnnArray[k]->NearestNeighbor(topology, scaling, x, d);
            if (d < d_min) {
                d_min = d;
                best_idx = n;
            }
            n_last = AnnArray[k]->LastNode();
            if (n_last != size) n_last++;
        }
    }

    for (n = n_last; n != size;
         n++) {  // Check the new nodes, which are not yet in the ANN tree
        ANNpoint x1 = points_coor[n];
        d = 0.0;
        for (int i = 0; i < dimension; i++) {
            if (topology[i] == 1) {
                d += ANN_POW(scaling[i] * (x1[i] - x[i]));
            } else if (topology[i] == 2) {
                double t = fabs(x1[i] - x[i]);
                double t1 = ANN_MIN(t, 2.0 * PI - t);
                d += ANN_POW(scaling[i] * t1);
            } else if (topology[i] == 3) {
                double fd = x1[i] * x[i] + x1[i + 1] * x[i + 1] +
                            x1[i + 2] * x[i + 2] + x1[i + 3] * x[i + 3];
                if (fd > 1) {
                    double norm1 = x1[i] * x1[i] + x1[i + 1] * x1[i + 1] +
                                   x1[i + 2] * x1[i + 2] +
                                   x1[i + 3] * x1[i + 3];
                    double norm2 = x[i] * x[i] + x[i + 1] * x[i + 1] +
                                   x[i + 2] * x[i + 2] + x[i + 3] * x[i + 3];
                    fd = fd / (norm1 * norm2);
                }
                double dtheta = ANN_MIN(acos(fd), acos(-fd));
                d += ANN_POW(scaling[i] * dtheta);
                i = i + 3;
            }
        }
        d = sqrt(d);
        if (d < d_min) {
            d_min = d;
            best_idx = n;
        }
    }

    best_dist = d_min;
    return points_ptr[best_idx];
}